

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_strip.c
# Opt level: O2

uint64_t TIFFRawStripSize64(TIFF *tif,uint32_t strip)

{
  uint64_t uVar1;
  
  uVar1 = TIFFGetStrileByteCount(tif,strip);
  if (uVar1 == 0) {
    TIFFErrorExtR(tif,"TIFFRawStripSize64","%lu: Invalid strip byte count, strip %lu",0,strip);
    uVar1 = 0xffffffffffffffff;
  }
  return uVar1;
}

Assistant:

uint64_t TIFFRawStripSize64(TIFF *tif, uint32_t strip)
{
    static const char module[] = "TIFFRawStripSize64";
    uint64_t bytecount = TIFFGetStrileByteCount(tif, strip);

    if (bytecount == 0)
    {
        TIFFErrorExtR(tif, module,
                      "%" PRIu64 ": Invalid strip byte count, strip %lu",
                      (uint64_t)bytecount, (unsigned long)strip);
        bytecount = (uint64_t)-1;
    }

    return bytecount;
}